

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(ImGuiKey key,ImGuiID owner_id,ImGuiInputFlags flags)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  ImGuiKeyData *pIVar4;
  uint in_EDX;
  float repeat_rate;
  float repeat_delay;
  bool pressed;
  float t;
  ImGuiKeyData *key_data;
  ImGuiKey in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  ImGuiKey key_00;
  bool local_1;
  
  pIVar4 = GetKeyData(in_stack_ffffffffffffffd4);
  if ((pIVar4->Down & 1U) == 0) {
    local_1 = false;
  }
  else {
    fVar1 = pIVar4->DownDuration;
    if (0.0 <= fVar1) {
      key_00 = CONCAT13(fVar1 == 0.0,(int3)in_stack_ffffffffffffffe0);
      if ((fVar1 != 0.0) && ((in_EDX & 1) != 0)) {
        GetTypematicRepeatRate
                  (in_EDX,(float *)&stack0xffffffffffffffdc,(float *)&stack0xffffffffffffffd8);
        bVar2 = false;
        if (in_stack_ffffffffffffffdc < fVar1) {
          iVar3 = GetKeyPressedAmount(key_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          bVar2 = 0 < iVar3;
        }
        key_00 = CONCAT13(bVar2,(int3)key_00);
      }
      if ((char)(key_00 >> 0x18) == '\0') {
        local_1 = false;
      }
      else {
        bVar2 = TestKeyOwner(key_00,(ImGuiID)in_stack_ffffffffffffffdc);
        if (bVar2) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, ImGuiID owner_id, ImGuiInputFlags flags)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down) // In theory this should already be encoded as (DownDuration < 0.0f), but testing this facilitates eating mechanism (until we finish work on key ownership)
        return false;
    const float t = key_data->DownDuration;
    if (t < 0.0f)
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByIsKeyPressed) == 0); // Passing flags not supported by this function!

    bool pressed = (t == 0.0f);
    if (!pressed && ((flags & ImGuiInputFlags_Repeat) != 0))
    {
        float repeat_delay, repeat_rate;
        GetTypematicRepeatRate(flags, &repeat_delay, &repeat_rate);
        pressed = (t > repeat_delay) && GetKeyPressedAmount(key, repeat_delay, repeat_rate) > 0;
    }
    if (!pressed)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}